

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

int CompareEdgesByOutput::cmp(void *param_1,void *param_2)

{
  uint uVar1;
  
  uVar1 = std::__cxx11::string::compare((string *)**(undefined8 **)((long)param_1 + 0x28));
  return uVar1 >> 0x1f;
}

Assistant:

static bool cmp(const Edge* a, const Edge* b) {
    return a->outputs_[0]->path() < b->outputs_[0]->path();
  }